

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ENGINE * load_engine(char *name)

{
  int iVar1;
  ENGINE *e;
  char *name_local;
  
  name_local = (char *)ENGINE_by_id("dynamic");
  if ((ENGINE *)name_local == (ENGINE *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    iVar1 = ENGINE_ctrl_cmd_string((ENGINE *)name_local,"SO_PATH",name,0);
    if ((iVar1 == 0) ||
       (iVar1 = ENGINE_ctrl_cmd_string((ENGINE *)name_local,"LOAD",(char *)0x0,0), iVar1 == 0)) {
      ENGINE_free((ENGINE *)name_local);
      name_local = (char *)0x0;
    }
  }
  return (ENGINE *)name_local;
}

Assistant:

static ENGINE *load_engine(const char *name)
{
    ENGINE *e;

    if ((e = ENGINE_by_id("dynamic")) == NULL)
        return NULL;
    if (!ENGINE_ctrl_cmd_string(e, "SO_PATH", name, 0) || !ENGINE_ctrl_cmd_string(e, "LOAD", NULL, 0)) {
        ENGINE_free(e);
        return NULL;
    }

    return e;
}